

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O2

void __thiscall QCborStreamWriter::QCborStreamWriter(QCborStreamWriter *this,QByteArray *data)

{
  _Head_base<0UL,_QCborStreamWriterPrivate_*,_false> _Var1;
  QBuffer *this_00;
  
  _Var1._M_head_impl = (QCborStreamWriterPrivate *)operator_new(0x48);
  this_00 = (QBuffer *)operator_new(0x10);
  QBuffer::QBuffer(this_00,data,(QObject *)0x0);
  (_Var1._M_head_impl)->device = (QIODevice *)this_00;
  ((_Var1._M_head_impl)->encoder).data = (anon_union_8_3_8ebc2b8a_for_data)0x0;
  ((_Var1._M_head_impl)->containerStack).super_QList<CborEncoder>.d.size = 0;
  *(undefined8 *)&((_Var1._M_head_impl)->containerStack).super_QList<CborEncoder> = 0;
  ((_Var1._M_head_impl)->containerStack).super_QList<CborEncoder>.d.ptr = (CborEncoder *)0x0;
  ((_Var1._M_head_impl)->encoder).end = (uint8_t *)_Var1._M_head_impl;
  ((_Var1._M_head_impl)->encoder).remaining = 2;
  ((_Var1._M_head_impl)->encoder).flags = 1;
  (this->d)._M_t.
  super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>.
  _M_t.
  super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
  .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl = _Var1._M_head_impl;
  (_Var1._M_head_impl)->deleteDevice = true;
  (*(this_00->super_QIODevice).super_QObject._vptr_QObject[0xd])(this_00,0x22);
  return;
}

Assistant:

QCborStreamWriter::QCborStreamWriter(QByteArray *data)
    : d(new QCborStreamWriterPrivate(new QBuffer(data)))
{
    d->deleteDevice = true;
    d->device->open(QIODevice::WriteOnly | QIODevice::Unbuffered);
}